

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * kj::StringTree::concat<>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  StringTree *in_RDI;
  Array<kj::StringTree::Branch> local_28;
  
  (in_RDI->branches).size_ = 0;
  (in_RDI->branches).disposer = (ArrayDisposer *)0x0;
  (in_RDI->text).content.disposer = (ArrayDisposer *)0x0;
  (in_RDI->branches).ptr = (Branch *)0x0;
  (in_RDI->text).content.ptr = (char *)0x0;
  (in_RDI->text).content.size_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDX;
  sVar4 = _::sum((_ *)0x0,(initializer_list<unsigned_long>)(auVar1 << 0x40));
  in_RDI->size_ = sVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = extraout_RDX;
  sVar4 = _::sum((_ *)0x0,(initializer_list<unsigned_long>)(auVar2 << 0x40));
  heapString((String *)&local_28,sVar4);
  Array<char>::operator=(&(in_RDI->text).content,(Array<char> *)&local_28);
  Array<char>::~Array((Array<char> *)&local_28);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = extraout_RDX_00;
  sVar4 = _::sum((_ *)0x0,(initializer_list<unsigned_long>)(auVar3 << 0x40));
  local_28.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar4);
  local_28.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_28.size_ = sVar4;
  Array<kj::StringTree::Branch>::operator=(&in_RDI->branches,&local_28);
  Array<kj::StringTree::Branch>::~Array(&local_28);
  return in_RDI;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}